

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  Message *descriptor;
  LogMessage *pLVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  string local_348;
  LogMessage local_328;
  char *local_2f0;
  undefined4 local_2e8;
  char local_2e4 [36];
  LogMessage local_2c0;
  LogMessage local_288;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  SubstituteArg local_100;
  SubstituteArg local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      if ((proto->field_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_328,pLVar2);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      ValidateFieldOptions
                (this,(FieldDescriptor *)(lVar1 + lVar5),
                 (FieldDescriptorProto *)(proto->field_).super_RepeatedPtrFieldBase.elements_[lVar4]
                );
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x78;
    } while (lVar4 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x38)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(message + 0x40);
      if ((proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_328,pLVar2);
        internal::LogMessage::~LogMessage(&local_68);
      }
      ValidateMessageOptions
                (this,(Descriptor *)(lVar1 + lVar5),
                 (DescriptorProto *)
                 (proto->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x78;
    } while (lVar4 < *(int *)(message + 0x38));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      if ((proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_2c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_2c0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_328,pLVar2);
        internal::LogMessage::~LogMessage(&local_2c0);
      }
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar5),
                          (EnumDescriptorProto *)
                          (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar4 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(message + 0x70);
      if ((proto->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = internal::LogMessage::operator<<(&local_288,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_328,pLVar2);
        internal::LogMessage::~LogMessage(&local_288);
      }
      ValidateFieldOptions
                (this,(FieldDescriptor *)(lVar1 + lVar5),
                 (FieldDescriptorProto *)
                 (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar4]);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x78;
    } while (lVar4 < *(int *)(message + 0x68));
  }
  lVar4 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x58) != '\0') {
    lVar4 = 0x7fffffff;
  }
  if (0 < *(int *)(message + 0x58)) {
    lVar5 = 0;
    do {
      if (lVar4 + 1 < (long)*(int *)(*(long *)(message + 0x60) + 4 + lVar5 * 8)) {
        element_name = *(string **)(message + 8);
        if ((proto->extension_range_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
          internal::LogMessage::LogMessage
                    (&local_328,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                     ,0x338);
          pLVar2 = internal::LogMessage::operator<<(&local_328,"CHECK failed: (index) < (size()): ")
          ;
          internal::LogFinisher::operator=((LogFinisher *)&local_2f0,pLVar2);
          internal::LogMessage::~LogMessage(&local_328);
        }
        descriptor = (Message *)
                     (proto->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar5];
        local_2f0 = FastInt64ToBuffer(lVar4,local_2e4);
        sVar3 = strlen(local_2f0);
        local_2e8 = (undefined4)sVar3;
        local_d0.text_ = (char *)0x0;
        local_d0.size_ = -1;
        local_100.text_ = (char *)0x0;
        local_100.size_ = -1;
        local_130.text_ = (char *)0x0;
        local_130.size_ = -1;
        local_160.text_ = (char *)0x0;
        local_160.size_ = -1;
        local_190.text_ = (char *)0x0;
        local_190.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_348,(strings *)"Extension numbers cannot be greater than $0.",
                   (char *)&local_2f0,&local_d0,&local_100,&local_130,&local_160,&local_190,
                   &local_1c0,&local_1f0,&local_220,&local_250,(SubstituteArg *)this);
        AddError(this,element_name,descriptor,NUMBER,&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(message + 0x58));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format() ?
                         kint32max :
                         FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}